

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.h
# Opt level: O3

Slot * __thiscall Model<Slot>::save(Model<Slot> *this)

{
  long lVar1;
  Slot *pSVar2;
  pair<int,_Slot> local_990;
  
  lVar1 = __dynamic_cast(this,&typeinfo,&Slot::typeinfo,0);
  if (lVar1 != 0) {
    local_990.first = this->id;
    local_990.second.super_Model<Slot>.id = *(int *)(lVar1 + 8);
    local_990.second.super_Model<Slot>._vptr_Model = (_func_int **)&PTR_save_0012c2a8;
    local_990.second.requestedBy.super_BaseUser.super_Model<BaseUser>.id = *(int *)(lVar1 + 0x18);
    memcpy(&local_990.second.requestedBy.super_BaseUser.super_Model<BaseUser>.field_0xc,
           (void *)(lVar1 + 0x1c),0xe1);
    local_990.second.requestedBy.super_BaseUser.super_Model<BaseUser>._vptr_Model =
         (_func_int **)&PTR_save_0012bf18;
    local_990.second.room.super_Model<Room>.id = *(int *)(lVar1 + 0x108);
    local_990.second.room.super_Model<Room>._vptr_Model = (_func_int **)&PTR_save_0012c2e0;
    local_990.second.room._20_2_ = *(undefined2 *)(lVar1 + 0x114);
    local_990.second.room._12_8_ = *(undefined8 *)(lVar1 + 0x10c);
    memcpy(&local_990.second.startTime,(void *)(lVar1 + 0x118),0x854);
    std::
    _Rb_tree<int,std::pair<int_const,Slot>,std::_Select1st<std::pair<int_const,Slot>>,std::less<int>,std::allocator<std::pair<int_const,Slot>>>
    ::_M_emplace_unique<std::pair<int,Slot>>
              ((_Rb_tree<int,std::pair<int_const,Slot>,std::_Select1st<std::pair<int_const,Slot>>,std::less<int>,std::allocator<std::pair<int_const,Slot>>>
                *)&objectList,&local_990);
    pSVar2 = (Slot *)__dynamic_cast(this,&typeinfo,&Slot::typeinfo,0);
    if (pSVar2 != (Slot *)0x0) {
      return pSVar2;
    }
  }
  __cxa_bad_cast();
}

Assistant:

T &Model<T>::save() {
    Model<T>::objectList.insert(pair<int, T>(this->id, dynamic_cast<T &> (*this)));
    return dynamic_cast<T &> (*this);
}